

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directories.cpp
# Opt level: O1

void directories::MADPCreateResultsDir(string *method,PlanningUnit *pu)

{
  string local_30;
  
  (*pu->_m_problem->_vptr_MultiAgentDecisionProcessInterface[4])(&local_30);
  MADPCreateResultsDir(method,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void directories::MADPCreateResultsDir(const string & method,
                                      const PlanningUnit *pu)
{
    return(MADPCreateResultsDir(method,pu->GetProblem()->GetUnixName()));
}